

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

bool P_ClipLineToPortal(line_t_conflict *line,line_t_conflict *portal,DVector2 *view,bool partial,
                       bool samebehind)

{
  int iVar1;
  bool local_91;
  DVector2 local_88;
  int local_74;
  undefined1 local_70 [4];
  int p2side;
  int local_60;
  int local_5c;
  int p1side;
  int viewside;
  int local_44;
  undefined1 local_40 [4];
  int behind2;
  int local_30;
  undefined1 local_2a;
  undefined1 local_29;
  int behind1;
  bool samebehind_local;
  bool partial_local;
  DVector2 *view_local;
  line_t_conflict *portal_local;
  line_t_conflict *line_local;
  
  local_2a = samebehind;
  local_29 = partial;
  _behind1 = view;
  view_local = (DVector2 *)portal;
  portal_local = line;
  vertex_t::fPos((vertex_t *)local_40);
  local_30 = P_GetLineSide((DVector2 *)local_40,(line_t_conflict *)view_local);
  vertex_t::fPos((vertex_t *)&p1side);
  local_44 = P_GetLineSide((DVector2 *)&p1side,(line_t_conflict *)view_local);
  if ((local_30 == 0) && (local_44 == 0)) {
    line_local._7_1_ = true;
  }
  else {
    if (local_44 == 0) {
      local_44 = local_30;
    }
    else if (local_30 == 0) {
      local_30 = local_44;
    }
    if ((local_30 < 1) || (local_44 < 1)) {
      if ((local_30 < 0) && (local_44 < 0)) {
        line_local._7_1_ = false;
      }
      else {
        local_5c = P_GetLineSide(view,portal_local);
        vertex_t::fPos((vertex_t *)local_70);
        local_60 = P_GetLineSide((DVector2 *)local_70,portal_local);
        vertex_t::fPos((vertex_t *)&local_88);
        local_74 = P_GetLineSide(&local_88,portal_local);
        iVar1 = local_74;
        if ((local_60 != 0) && (iVar1 = local_60, local_74 == 0)) {
          local_74 = local_60;
        }
        local_60 = iVar1;
        local_91 = local_60 == local_74 && local_5c != local_60;
        line_local._7_1_ = local_91;
      }
    }
    else {
      line_local._7_1_ = true;
    }
  }
  return line_local._7_1_;
}

Assistant:

bool P_ClipLineToPortal(line_t* line, line_t* portal, DVector2 view, bool partial, bool samebehind)
{
	int behind1 = P_GetLineSide(line->v1->fPos(), portal);
	int behind2 = P_GetLineSide(line->v2->fPos(), portal);

	if (behind1 == 0 && behind2 == 0)
	{
		// The line is parallel to the portal and cannot possibly be visible.
		return true;
	}
	// If one point lies on the same straight line than the portal, the other vertex will determine sidedness alone.
	else if (behind2 == 0) behind2 = behind1;
	else if (behind1 == 0) behind1 = behind2;

	if (behind1 > 0 && behind2 > 0)
	{
		// The line is behind the portal, i.e. between viewer and portal line, and must be rejected
		return true;
	}
	else if (behind1 < 0 && behind2 < 0)
	{
		// The line is in front of the portal, i.e. the portal is between viewer and line. This line must not be rejected
		return false;
	}
	else
	{
		// The line intersects with the portal straight, so we need to do another check to see how both ends of the portal lie in relation to the viewer.
		int viewside = P_GetLineSide(view, line); 
		int p1side = P_GetLineSide(portal->v1->fPos(), line);
		int p2side = P_GetLineSide(portal->v2->fPos(), line);
		// Do the same handling of points on the portal straight as above.
		if (p1side == 0) p1side = p2side;
		else if (p2side == 0) p2side = p1side;
		// If the portal is on the other side of the line than the viewpoint, there is no possibility to see this line inside the portal.
		return (p1side == p2side && viewside != p1side);
	}
}